

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O0

bool duckdb::VectorCastHelpers::
     TryCastStrictLoop<duckdb::string_t,duckdb::hugeint_t,duckdb::TryCast>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  bool bVar1;
  CastParameters *in_RDX;
  idx_t in_RSI;
  Vector *in_RDI;
  Vector *unaff_retaddr;
  
  bVar1 = TemplatedTryCastLoop<duckdb::string_t,duckdb::hugeint_t,duckdb::VectorTryCastStrictOperator<duckdb::TryCast>>
                    (unaff_retaddr,in_RDI,in_RSI,in_RDX);
  return bVar1;
}

Assistant:

static bool TryCastStrictLoop(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
		return TemplatedTryCastLoop<SRC, DST, VectorTryCastStrictOperator<OP>>(source, result, count, parameters);
	}